

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O3

void __thiscall
t_cpp_generator::generate_service_interface(t_cpp_generator *this,t_service *tservice,string *style)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int *piVar2;
  pointer pcVar3;
  t_function *tfunction;
  int iVar4;
  long *plVar5;
  ostream *poVar6;
  long *plVar7;
  size_type *psVar8;
  pointer pptVar9;
  char *__end;
  pointer *ppptVar10;
  string extends;
  string service_if_name;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  string local_f0;
  string local_d0;
  vector<t_function_*,_std::allocator<t_function_*>_> local_b0;
  long lStack_98;
  string local_90;
  string local_70;
  string local_50;
  
  std::operator+(&local_130,&(this->super_t_oop_generator).super_t_generator.service_name_,style);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_130);
  local_110 = &local_100;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_100 = *plVar7;
    lStack_f8 = plVar5[3];
  }
  else {
    local_100 = *plVar7;
    local_110 = (long *)*plVar5;
  }
  local_108 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  iVar4 = std::__cxx11::string::compare((char *)style);
  if (iVar4 == 0) {
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    pcVar3 = (this->super_t_oop_generator).super_t_generator.service_name_._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,pcVar3,
               pcVar3 + (this->super_t_oop_generator).super_t_generator.service_name_.
                        _M_string_length);
    std::__cxx11::string::append((char *)&local_130);
    if (this->gen_templates_ == true) {
      std::__cxx11::string::append((char *)&local_130);
      std::__cxx11::string::append((char *)&local_110);
      poVar6 = t_generator::indent((t_generator *)this,(ostream *)&this->f_header_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"template <class Protocol_>",0x1a);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
    poVar6 = t_generator::indent((t_generator *)this,(ostream *)&this->f_header_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"class ",6);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_130._M_dataplus._M_p,local_130._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,";",1);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
  }
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"");
  if (tservice->extends_ != (t_service *)0x0) {
    type_name_abi_cxx11_(&local_50,this,&tservice->extends_->super_t_type,false,false);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x37fffc);
    ppptVar10 = &local_b0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    plVar7 = plVar5 + 2;
    if ((pointer *)*plVar5 == (pointer *)plVar7) {
      local_b0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*plVar7;
      lStack_98 = plVar5[3];
      local_b0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)ppptVar10;
    }
    else {
      local_b0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*plVar7;
      local_b0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)*plVar5;
    }
    local_b0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_b0,(ulong)(style->_M_dataplus)._M_p);
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_d0.field_2._M_allocated_capacity = *psVar8;
      local_d0.field_2._8_8_ = plVar5[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar8;
      local_d0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_d0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_d0);
    psVar8 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_f0.field_2._M_allocated_capacity = *psVar8;
      local_f0.field_2._8_8_ = plVar5[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar8;
      local_f0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_f0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_130,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if (local_b0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)ppptVar10) {
      operator_delete(local_b0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    iVar4 = std::__cxx11::string::compare((char *)style);
    if ((iVar4 == 0) && (this->gen_templates_ == true)) {
      std::__cxx11::string::append((char *)&local_130);
    }
  }
  iVar4 = std::__cxx11::string::compare((char *)style);
  if ((iVar4 == 0) && (this->gen_templates_ == true)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&this->f_header_,"template <class Protocol_>",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&this->f_header_,::endl_abi_cxx11_._M_dataplus._M_p,
               ::endl_abi_cxx11_._M_string_length);
  }
  poVar1 = &this->f_header_;
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x22])(this,poVar1,tservice);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"class ",6);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,(char *)local_110,local_108);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_130._M_dataplus._M_p,local_130._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," {",2);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," public:",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_f0._M_dataplus._M_p,local_f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"virtual ~",9);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_110,local_108);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"() {}",5);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&local_b0,&tservice->functions_);
  if (local_b0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_b0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppptVar10 = (pointer *)
                local_b0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    do {
      pptVar9 = *ppptVar10;
      if (*(char *)(pptVar9 + 5) == '\x01') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,
                   ::endl_abi_cxx11_._M_string_length);
        pptVar9 = *ppptVar10;
      }
      (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x23])
                (this,poVar1,pptVar9);
      t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)poVar1,local_f0._M_dataplus._M_p,local_f0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"virtual ",8);
      tfunction = (t_function *)*ppptVar10;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      pcVar3 = (style->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar3,pcVar3 + style->_M_string_length);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"","");
      function_signature(&local_d0,this,tfunction,&local_90,&local_70,true);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_d0._M_dataplus._M_p,local_d0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," = 0;",5);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      ppptVar10 = ppptVar10 + 1;
    } while ((pointer)ppptVar10 !=
             local_b0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"};",2);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  iVar4 = std::__cxx11::string::compare((char *)style);
  if ((iVar4 == 0) && (this->gen_templates_ == true)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"typedef ",8);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar1,(char *)local_110,local_108);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"< ::apache::thrift::protocol::TProtocol> ",0x29);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(this->super_t_oop_generator).super_t_generator.service_name_.
                               _M_dataplus._M_p,
                        (this->super_t_oop_generator).super_t_generator.service_name_.
                        _M_string_length);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(style->_M_dataplus)._M_p,style->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"If;",3);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  if (local_b0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  return;
}

Assistant:

void t_cpp_generator::generate_service_interface(t_service* tservice, string style) {

  string service_if_name = service_name_ + style + "If";
  if (style == "CobCl") {
    // Forward declare the client.
    string client_name = service_name_ + "CobClient";
    if (gen_templates_) {
      client_name += "T";
      service_if_name += "T";
      indent(f_header_) << "template <class Protocol_>" << endl;
    }
    indent(f_header_) << "class " << client_name << ";" << endl << endl;
  }

  string extends = "";
  if (tservice->get_extends() != nullptr) {
    extends = " : virtual public " + type_name(tservice->get_extends()) + style + "If";
    if (style == "CobCl" && gen_templates_) {
      // TODO(simpkins): If gen_templates_ is enabled, we currently assume all
      // parent services were also generated with templates enabled.
      extends += "T<Protocol_>";
    }
  }

  if (style == "CobCl" && gen_templates_) {
    f_header_ << "template <class Protocol_>" << endl;
  }

  generate_java_doc(f_header_, tservice);

  f_header_ << "class " << service_if_name << extends << " {" << endl << " public:" << endl;
  indent_up();
  f_header_ << indent() << "virtual ~" << service_if_name << "() {}" << endl;

  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    if ((*f_iter)->has_doc())
      f_header_ << endl;
    generate_java_doc(f_header_, *f_iter);
    f_header_ << indent() << "virtual " << function_signature(*f_iter, style) << " = 0;" << endl;
  }
  indent_down();
  f_header_ << "};" << endl << endl;

  if (style == "CobCl" && gen_templates_) {
    // generate a backwards-compatible typedef for clients that do not
    // know about the new template-style code
    f_header_ << "typedef " << service_if_name << "< ::apache::thrift::protocol::TProtocol> "
              << service_name_ << style << "If;" << endl << endl;
  }
}